

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O0

uint4 Override::stringToType(string *nm)

{
  bool bVar1;
  string *nm_local;
  
  bVar1 = std::operator==(nm,"branch");
  if (bVar1) {
    nm_local._4_4_ = 1;
  }
  else {
    bVar1 = std::operator==(nm,"call");
    if (bVar1) {
      nm_local._4_4_ = 2;
    }
    else {
      bVar1 = std::operator==(nm,"callreturn");
      if (bVar1) {
        nm_local._4_4_ = 3;
      }
      else {
        bVar1 = std::operator==(nm,"return");
        if (bVar1) {
          nm_local._4_4_ = 4;
        }
        else {
          nm_local._4_4_ = 0;
        }
      }
    }
  }
  return nm_local._4_4_;
}

Assistant:

uint4 Override::stringToType(const string &nm)

{
  if (nm == "branch")
    return Override::BRANCH;
  else if (nm == "call")
    return Override::CALL;
  else if (nm == "callreturn")
    return Override::CALL_RETURN;
  else if (nm == "return")
    return Override::RETURN;
  return Override::NONE;
}